

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::doWalkFunction(I64ToI32Lowering *this,Function *func)

{
  Module *pMVar1;
  pointer pTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  I64ToI32Lowering *pIVar5;
  Function *pFVar6;
  bool bVar7;
  Index IVar8;
  Builder *pBVar9;
  Function *func_00;
  size_t sVar10;
  wasm *this_00;
  Type TVar11;
  mapped_type *pmVar12;
  size_t in_RCX;
  uint uVar13;
  uchar *in_R8;
  size_t in_R9;
  mapped_type mVar14;
  code *pcVar15;
  Signature SVar16;
  Name NVar17;
  Name n;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *symbolNameIndexMap;
  Module temp;
  size_t local_98;
  char *local_90;
  void *local_78 [2];
  long local_68;
  char local_60;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  I64ToI32Lowering *local_50;
  mapped_type local_44;
  Function *local_40;
  HeapType local_38;
  
  symbolNameIndexMap = (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x0;
  temp.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.tables.
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.tables.
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.tables.
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.start.super_IString.str._M_str = (char *)0x0;
  temp.start.super_IString.str._M_len = (size_t)func;
  Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::walk
            ((Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_> *)
             &stack0xfffffffffffffb58,&func->body);
  temp.start.super_IString.str._M_len = (size_t)func;
  Flat::anon_func::VerifyFlatness::verify
            ((VerifyFlatness *)&stack0xfffffffffffffb58,
             (EVP_PKEY_CTX *)(ulong)((func->body->type).id < 2),
             (uchar *)"function bodies must not flow values",in_RCX,in_R8,in_R9);
  local_40 = func;
  if (temp.tables.
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp.tables.
                    super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)temp.tables.
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)temp.tables.
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_50 = this;
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule;
    pBVar9 = (Builder *)operator_new(8);
    pBVar9->wasm = pMVar1;
    (local_50->builder)._M_t.
    super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
    super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = pBVar9;
  }
  pIVar5 = local_50;
  local_58 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&local_50->indexMap;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_58);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(pIVar5->highBitVars)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(pIVar5->freeTemps)._M_h);
  Module::Module((Module *)&stack0xfffffffffffffb58);
  local_60 = '\0';
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_78;
  func_00 = wasm::ModuleUtils::copyFunction
                      ((ModuleUtils *)local_40,(Function *)&stack0xfffffffffffffb58,(Module *)0x0,
                       (Name)(auVar3 << 0x40),
                       (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &temp.tagsMap._M_h._M_single_bucket,symbolNameIndexMap);
  pFVar6 = local_40;
  if ((local_60 == '\x01') && (local_60 = '\0', local_78[0] != (void *)0x0)) {
    operator_delete(local_78[0],local_68 - (long)local_78[0]);
  }
  SVar16 = HeapType::getSignature(&pFVar6->type);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar16.results.id.id;
  HeapType::HeapType(&local_38,(Signature)(auVar4 << 0x40));
  (pFVar6->type).id = CONCAT44(local_38.id._4_4_,(uint)local_38.id);
  pTVar2 = (pFVar6->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pFVar6->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    (pFVar6->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(pFVar6->localNames)._M_h);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(pFVar6->localIndices)._M_h);
  Names::ensureNames(func_00);
  uVar13 = 0;
  mVar14 = 0;
  while( true ) {
    local_38.id._0_4_ = uVar13;
    sVar10 = Function::getNumLocals(func_00);
    if (sVar10 <= uVar13) {
      sVar10 = Function::getNumLocals(local_40);
      local_50->nextTemp = (Index)sVar10;
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::walk
                (&(local_50->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,&func->body);
      Module::~Module((Module *)&stack0xfffffffffffffb58);
      return;
    }
    bVar7 = Function::hasLocalName(func_00,(uint)local_38.id);
    if (!bVar7) break;
    NVar17 = Function::getLocalName(func_00,(uint)local_38.id);
    n.super_IString.str._M_str = NVar17.super_IString.str._M_str;
    this_00 = NVar17.super_IString.str._M_len;
    n.super_IString.str._M_len = (size_t)n.super_IString.str._M_str;
    NVar17 = makeHighName(this_00,n);
    local_44 = mVar14;
    TVar11 = Function::getLocalType(func_00,(uint)local_38.id);
    uVar13 = (uint)local_38.id;
    IVar8 = Function::getVarIndexBase(func_00);
    pcVar15 = Builder::addVar;
    if (uVar13 < IVar8) {
      pcVar15 = Builder::addParam;
    }
    if (TVar11.id == 3) {
      (*pcVar15)(local_40,this_00,n.super_IString.str._M_str,2);
      local_98 = NVar17.super_IString.str._M_len;
      local_90 = NVar17.super_IString.str._M_str;
      (*pcVar15)(local_40,local_98,local_90,2);
      pmVar12 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_58,(key_type *)&local_38);
      *pmVar12 = local_44;
      mVar14 = local_44 + 2;
    }
    else {
      (*pcVar15)(local_40,this_00,n.super_IString.str._M_str,TVar11.id);
      pmVar12 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_58,(key_type *)&local_38);
      *pmVar12 = local_44;
      mVar14 = local_44 + 1;
    }
    uVar13 = (uint)local_38.id + 1;
  }
  __assert_fail("oldFunc->hasLocalName(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0xae,"void wasm::I64ToI32Lowering::doWalkFunction(Function *)");
}

Assistant:

void doWalkFunction(Function* func) {
    Flat::verifyFlatness(func);
    // create builder here if this is first entry to module for this object
    if (!builder) {
      builder = std::make_unique<Builder>(*getModule());
    }
    indexMap.clear();
    highBitVars.clear();
    freeTemps.clear();
    Module temp;
    auto* oldFunc = ModuleUtils::copyFunction(func, temp);
    func->setParams(Type::none);
    func->vars.clear();
    func->localNames.clear();
    func->localIndices.clear();
    Index newIdx = 0;
    Names::ensureNames(oldFunc);
    for (Index i = 0; i < oldFunc->getNumLocals(); ++i) {
      assert(oldFunc->hasLocalName(i));
      Name lowName = oldFunc->getLocalName(i);
      Name highName = makeHighName(lowName);
      Type paramType = oldFunc->getLocalType(i);
      auto builderFunc =
        (i < oldFunc->getVarIndexBase())
          ? Builder::addParam
          : static_cast<Index (*)(Function*, Name, Type)>(Builder::addVar);
      if (paramType == Type::i64) {
        builderFunc(func, lowName, Type::i32);
        builderFunc(func, highName, Type::i32);
        indexMap[i] = newIdx;
        newIdx += 2;
      } else {
        builderFunc(func, lowName, paramType);
        indexMap[i] = newIdx++;
      }
    }
    nextTemp = func->getNumLocals();
    PostWalker<I64ToI32Lowering>::doWalkFunction(func);
  }